

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSAify.cpp
# Opt level: O3

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::SSAify::create(SSAify *this)

{
  undefined1 uVar1;
  _func_int **pp_Var2;
  long in_RSI;
  
  pp_Var2 = (_func_int **)operator_new(0x60);
  uVar1 = *(undefined1 *)(in_RSI + 0x30);
  pp_Var2[1] = (_func_int *)0x0;
  pp_Var2[2] = (_func_int *)(pp_Var2 + 4);
  pp_Var2[3] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var2 + 4) = 0;
  *pp_Var2 = (_func_int *)&PTR__SSAify_00d76718;
  *(undefined1 *)(pp_Var2 + 6) = uVar1;
  pp_Var2[0xb] = (_func_int *)0x0;
  pp_Var2[9] = (_func_int *)0x0;
  pp_Var2[10] = (_func_int *)0x0;
  (this->super_Pass)._vptr_Pass = pp_Var2;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<SSAify>(allowMerges);
  }